

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_long_type_param_tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  UnitTestSource *pUVar2;
  Fixed *pFVar3;
  char *pcVar4;
  AssertionHelper local_16f8;
  int local_16c8;
  AssertionReturnType<int> local_16c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c0;
  Fixed local_16a0;
  ReturnTypedFixed<int> local_1518;
  unsigned_long local_1388;
  undefined1 local_1380 [8];
  AssertionResult iutest_ar_5;
  int local_1328;
  AssertionReturnType<int> local_1324;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1320;
  Fixed local_1300;
  ReturnTypedFixed<int> local_1178;
  unsigned_long local_fe8;
  undefined1 local_fe0 [8];
  AssertionResult iutest_ar_4;
  int local_f88;
  AssertionReturnType<int> local_f84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f80;
  Fixed local_f60;
  ReturnTypedFixed<int> local_dd8;
  unsigned_long local_c48;
  undefined1 local_c40 [8];
  AssertionResult iutest_ar_3;
  undefined1 local_c10 [4];
  int ret_1;
  AssertionHelper local_bf0;
  int local_bc0;
  AssertionReturnType<int> local_bbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  Fixed local_b98;
  ReturnTypedFixed<int> local_a10;
  unsigned_long local_880;
  undefined1 local_878 [8];
  AssertionResult iutest_ar_2;
  int local_820;
  AssertionReturnType<int> local_81c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  Fixed local_7f8;
  ReturnTypedFixed<int> local_670;
  unsigned_long local_4e0;
  undefined1 local_4d8 [8];
  AssertionResult iutest_ar_1;
  int local_480;
  AssertionReturnType<int> local_47c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  Fixed local_458;
  ReturnTypedFixed<int> local_2d0;
  unsigned_long local_140;
  undefined1 local_138 [8];
  AssertionResult iutest_ar;
  undefined1 local_108 [4];
  int ret;
  string local_e8;
  undefined1 local_c8 [8];
  string xml_type_param2;
  undefined1 local_88 [8];
  string xml_type_param1;
  string local_58 [8];
  string type_param2;
  string type_param1;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  iutest::InitIrisUnitTest((int *)&argv_local,argv);
  iutest::detail::
  GetTypeNameProxy<iutest::Types<int,float,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None,iutest::detail::None>>
  ::GetTypeName_abi_cxx11_();
  iutest::detail::
  GetTypeNameProxy<TestType<TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone,TestNone>>
  ::GetTypeName_abi_cxx11_();
  std::__cxx11::string::string
            ((string *)(xml_type_param2.field_2._M_local_buf + 8),
             (string *)(type_param2.field_2._M_local_buf + 8));
  iutest::DefaultXmlGeneratorListener::EscapeXmlAttribute
            ((string *)local_88,(string *)((long)&xml_type_param2.field_2 + 8));
  std::__cxx11::string::~string((string *)(xml_type_param2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_e8,local_58);
  iutest::DefaultXmlGeneratorListener::EscapeXmlAttribute((string *)local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  OptionString((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                *)local_108);
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
             *)local_108,"xml:test.xml");
  iutest::TestEnv::
  OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>::
  ~OptionString((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                 *)local_108);
  pUVar2 = iutest::UnitTestSource::GetInstance();
  iutest_ar._36_4_ = iutest::UnitTestSource::Run(pUVar2);
  if (iutest_ar._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_140 = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x152205);
    iutest::internal::backward::EqHelper<false>::Compare<unsigned_long>
              ((AssertionResult *)local_138,"::std::string::npos",
               "FileIO::s_io.find(\"iutest::detail::None\")",&std::__cxx11::string::npos,&local_140)
    ;
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
    if (!bVar1) {
      memset(&local_458,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_458);
      std::__cxx11::string::string((string *)&local_478,(string *)&FileIO::s_io_abi_cxx11_);
      pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_458,&local_478);
      local_480 = 1;
      local_47c = iutest::AssertionReturn<int>(&local_480);
      iutest::AssertionHelper::Fixed::operator<<(&local_2d0,pFVar3,&local_47c);
      pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_138);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_1.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                 ,0x5d,pcVar4,kFatalFailure);
      argv_local._4_4_ =
           iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_2d0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
      iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_2d0);
      std::__cxx11::string::~string((string *)&local_478);
      iutest::AssertionHelper::Fixed::~Fixed(&local_458);
    }
    iutest_ar._33_3_ = 0;
    iutest_ar.m_result = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    if (iutest_ar._32_4_ == 0) {
      iutest::detail::AlwaysZero();
      local_4e0 = std::__cxx11::string::find((string *)&FileIO::s_io_abi_cxx11_,(ulong)local_88);
      iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                ((AssertionResult *)local_4d8,"::std::string::npos",
                 "FileIO::s_io.find(xml_type_param1)",&std::__cxx11::string::npos,&local_4e0);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
      if (!bVar1) {
        memset(&local_7f8,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_7f8);
        std::__cxx11::string::string((string *)&local_818,(string *)&FileIO::s_io_abi_cxx11_);
        pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_7f8,&local_818);
        local_820 = 1;
        local_81c = iutest::AssertionReturn<int>(&local_820);
        iutest::AssertionHelper::Fixed::operator<<(&local_670,pFVar3,&local_81c);
        pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_4d8);
        iutest::AssertionHelper::AssertionHelper
                  ((AssertionHelper *)&iutest_ar_2.m_result,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                   ,0x5e,pcVar4,kFatalFailure);
        argv_local._4_4_ =
             iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_670)
        ;
        iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
        iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_670);
        std::__cxx11::string::~string((string *)&local_818);
        iutest::AssertionHelper::Fixed::~Fixed(&local_7f8);
      }
      iutest_ar._33_3_ = 0;
      iutest_ar.m_result = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
      if (iutest_ar._32_4_ == 0) {
        iutest::detail::AlwaysZero();
        local_880 = std::__cxx11::string::find((string *)&FileIO::s_io_abi_cxx11_,(ulong)local_c8);
        iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                  ((AssertionResult *)local_878,"::std::string::npos",
                   "FileIO::s_io.find(xml_type_param2)",&std::__cxx11::string::npos,&local_880);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_878);
        if (!bVar1) {
          memset(&local_b98,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_b98);
          std::__cxx11::string::string((string *)&local_bb8,(string *)&FileIO::s_io_abi_cxx11_);
          pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_b98,&local_bb8);
          local_bc0 = 1;
          local_bbc = iutest::AssertionReturn<int>(&local_bc0);
          iutest::AssertionHelper::Fixed::operator<<(&local_a10,pFVar3,&local_bbc);
          pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_878);
          iutest::AssertionHelper::AssertionHelper
                    (&local_bf0,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                     ,0x5f,pcVar4,kFatalFailure);
          argv_local._4_4_ = iutest::AssertionHelper::operator=(&local_bf0,&local_a10);
          iutest::AssertionHelper::~AssertionHelper(&local_bf0);
          iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_a10);
          std::__cxx11::string::~string((string *)&local_bb8);
          iutest::AssertionHelper::Fixed::~Fixed(&local_b98);
        }
        iutest_ar._33_3_ = 0;
        iutest_ar.m_result = !bVar1;
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_878);
        if (iutest_ar._32_4_ == 0) {
          std::__cxx11::string::clear();
          iutest::TestEnv::
          OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
          ::OptionString((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                          *)local_c10);
          iutest::TestEnv::
          OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
          ::operator=((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                       *)local_c10,"junit:test.xml");
          iutest::TestEnv::
          OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
          ::~OptionString((OptionString<&iutest::TestEnv::get_output_option_c_str,_&iutest::TestEnv::set_output_option>
                           *)local_c10);
          pUVar2 = iutest::UnitTestSource::GetInstance();
          iutest_ar_3._36_4_ = iutest::UnitTestSource::Run(pUVar2);
          if (iutest_ar_3._36_4_ == 0) {
            iutest::detail::AlwaysZero();
            local_c48 = std::__cxx11::string::find((char *)&FileIO::s_io_abi_cxx11_,0x152205);
            iutest::internal::backward::EqHelper<false>::Compare<unsigned_long>
                      ((AssertionResult *)local_c40,"::std::string::npos",
                       "FileIO::s_io.find(\"iutest::detail::None\")",&std::__cxx11::string::npos,
                       &local_c48);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c40);
            if (!bVar1) {
              memset(&local_f60,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_f60);
              std::__cxx11::string::string((string *)&local_f80,(string *)&FileIO::s_io_abi_cxx11_);
              pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_f60,&local_f80);
              local_f88 = 1;
              local_f84 = iutest::AssertionReturn<int>(&local_f88);
              iutest::AssertionHelper::Fixed::operator<<(&local_dd8,pFVar3,&local_f84);
              pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_c40);
              iutest::AssertionHelper::AssertionHelper
                        ((AssertionHelper *)&iutest_ar_4.m_result,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                         ,0x68,pcVar4,kFatalFailure);
              argv_local._4_4_ =
                   iutest::AssertionHelper::operator=
                             ((AssertionHelper *)&iutest_ar_4.m_result,&local_dd8);
              iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
              iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_dd8);
              std::__cxx11::string::~string((string *)&local_f80);
              iutest::AssertionHelper::Fixed::~Fixed(&local_f60);
            }
            iutest_ar._33_3_ = 0;
            iutest_ar.m_result = !bVar1;
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_c40);
            if (iutest_ar._32_4_ == 0) {
              iutest::detail::AlwaysZero();
              local_fe8 = std::__cxx11::string::find
                                    ((string *)&FileIO::s_io_abi_cxx11_,(ulong)local_88);
              iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                        ((AssertionResult *)local_fe0,"::std::string::npos",
                         "FileIO::s_io.find(xml_type_param1)",&std::__cxx11::string::npos,&local_fe8
                        );
              bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fe0);
              if (!bVar1) {
                memset(&local_1300,0,0x188);
                iutest::AssertionHelper::Fixed::Fixed(&local_1300);
                std::__cxx11::string::string
                          ((string *)&local_1320,(string *)&FileIO::s_io_abi_cxx11_);
                pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_1300,&local_1320);
                local_1328 = 1;
                local_1324 = iutest::AssertionReturn<int>(&local_1328);
                iutest::AssertionHelper::Fixed::operator<<(&local_1178,pFVar3,&local_1324);
                pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_fe0);
                iutest::AssertionHelper::AssertionHelper
                          ((AssertionHelper *)&iutest_ar_5.m_result,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                           ,0x69,pcVar4,kFatalFailure);
                argv_local._4_4_ =
                     iutest::AssertionHelper::operator=
                               ((AssertionHelper *)&iutest_ar_5.m_result,&local_1178);
                iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
                iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1178);
                std::__cxx11::string::~string((string *)&local_1320);
                iutest::AssertionHelper::Fixed::~Fixed(&local_1300);
              }
              iutest_ar._33_3_ = 0;
              iutest_ar.m_result = !bVar1;
              iutest::AssertionResult::~AssertionResult((AssertionResult *)local_fe0);
              if (iutest_ar._32_4_ == 0) {
                iutest::detail::AlwaysZero();
                local_1388 = std::__cxx11::string::find
                                       ((string *)&FileIO::s_io_abi_cxx11_,(ulong)local_c8);
                iutest::internal::backward::NeHelper<false>::Compare<unsigned_long>
                          ((AssertionResult *)local_1380,"::std::string::npos",
                           "FileIO::s_io.find(xml_type_param2)",&std::__cxx11::string::npos,
                           &local_1388);
                bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1380);
                if (!bVar1) {
                  memset(&local_16a0,0,0x188);
                  iutest::AssertionHelper::Fixed::Fixed(&local_16a0);
                  std::__cxx11::string::string
                            ((string *)&local_16c0,(string *)&FileIO::s_io_abi_cxx11_);
                  pFVar3 = iutest::AssertionHelper::Fixed::operator<<(&local_16a0,&local_16c0);
                  local_16c8 = 1;
                  local_16c4 = iutest::AssertionReturn<int>(&local_16c8);
                  iutest::AssertionHelper::Fixed::operator<<(&local_1518,pFVar3,&local_16c4);
                  pcVar4 = iutest::AssertionResult::message((AssertionResult *)local_1380);
                  iutest::AssertionHelper::AssertionHelper
                            (&local_16f8,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_long_type_param_tests.cpp"
                             ,0x6a,pcVar4,kFatalFailure);
                  argv_local._4_4_ = iutest::AssertionHelper::operator=(&local_16f8,&local_1518);
                  iutest::AssertionHelper::~AssertionHelper(&local_16f8);
                  iutest::AssertionHelper::ReturnTypedFixed<int>::~ReturnTypedFixed(&local_1518);
                  std::__cxx11::string::~string((string *)&local_16c0);
                  iutest::AssertionHelper::Fixed::~Fixed(&local_16a0);
                }
                iutest_ar._33_3_ = 0;
                iutest_ar.m_result = !bVar1;
                iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1380);
                if (iutest_ar._32_4_ == 0) {
                  std::__cxx11::string::clear();
                  printf("*** Successful ***\n");
                  argv_local._4_4_ = 0;
                  iutest_ar.m_result = true;
                  iutest_ar._33_3_ = 0;
                }
              }
            }
          }
          else {
            argv_local._4_4_ = 1;
            iutest_ar.m_result = true;
            iutest_ar._33_3_ = 0;
          }
        }
      }
    }
  }
  else {
    argv_local._4_4_ = 1;
    iutest_ar.m_result = true;
    iutest_ar._33_3_ = 0;
  }
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)(type_param2.field_2._M_local_buf + 8));
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
#if OUTPUT_XML_TEST
    IUTEST_INIT(&argc, argv);

    const ::std::string type_param1 = iutest::detail::GetTypeNameProxy< ::iutest::Types<int, float> >::GetTypeName();
    const ::std::string type_param2 = iutest::detail::GetTypeNameProxy< AliasTestType >::GetTypeName();
    const ::std::string xml_type_param1 = HackXmlGeneratorListener::EscapeXmlAttribute(type_param1);
    const ::std::string xml_type_param2 = HackXmlGeneratorListener::EscapeXmlAttribute(type_param2);

    ::iutest::IUTEST_FLAG(output) = "xml:test.xml";
    {
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret != 0 ) return 1;
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("iutest::detail::None")) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param1)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param2)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        FileIO::s_io.clear();
    }

    ::iutest::IUTEST_FLAG(output) = "junit:test.xml";
    {
        const int ret = IUTEST_RUN_ALL_TESTS();

        if( ret != 0 ) return 1;
        IUTEST_ASSERT_EQ(::std::string::npos, FileIO::s_io.find("iutest::detail::None")) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param1)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        IUTEST_ASSERT_NE(::std::string::npos, FileIO::s_io.find(xml_type_param2)) << FileIO::s_io << ::iutest::AssertionReturn<int>(1);
        FileIO::s_io.clear();
    }
    printf("*** Successful ***\n");
#else
    (void)argc;
    (void)argv;
    printf("*** OUTPUT_XML_TEST=0 ***\n");
#endif
    return 0;
}